

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

string<unsigned_short> __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::replaceSpecialCharacters
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,string<unsigned_short> *origstr)

{
  u32 uVar1;
  int iVar2;
  int length;
  bool bVar3;
  s32 sVar4;
  u32 uVar5;
  s32 sVar6;
  string<unsigned_short> *psVar7;
  unsigned_short *str1;
  unsigned_short *puVar8;
  string<unsigned_short> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  string<unsigned_short> sVar10;
  string<unsigned_short> local_80;
  string<unsigned_short> local_70;
  string<unsigned_short> local_60;
  unsigned_short *local_50;
  unsigned_short *p;
  u32 local_34;
  u32 local_30;
  int i;
  int specialChar;
  s32 local_24;
  int oldPos;
  int pos;
  string<unsigned_short> *origstr_local;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  string<unsigned_short> *newstr;
  
  _oldPos = in_RDX;
  origstr_local = origstr;
  this_local = this;
  local_24 = core::string<unsigned_short>::findFirst(in_RDX,0x26);
  specialChar = 0;
  if (local_24 == -1) {
    core::string<unsigned_short>::string((string<unsigned_short> *)this,_oldPos);
    uVar9 = extraout_RDX;
  }
  else {
    i._3_1_ = 0;
    core::string<unsigned_short>::string((string<unsigned_short> *)this);
    while( true ) {
      sVar6 = local_24;
      bVar3 = false;
      if (local_24 != -1) {
        sVar4 = core::string<unsigned_short>::size(_oldPos);
        bVar3 = sVar6 < sVar4 + -2;
      }
      iVar2 = specialChar;
      if (!bVar3) break;
      local_30 = 0xffffffff;
      for (local_34 = 0; uVar1 = local_34,
          uVar5 = core::array<irr::core::string<unsigned_short>_>::size
                            ((array<irr::core::string<unsigned_short>_> *)&origstr[5].allocated),
          (int)uVar1 < (int)uVar5; local_34 = local_34 + 1) {
        local_50 = core::string<unsigned_short>::c_str(_oldPos);
        local_50 = local_50 + (long)local_24 + 1;
        psVar7 = core::array<irr::core::string<unsigned_short>_>::operator[]
                           ((array<irr::core::string<unsigned_short>_> *)&origstr[5].allocated,
                            local_34);
        str1 = core::string<unsigned_short>::operator[](psVar7,1);
        puVar8 = local_50;
        psVar7 = core::array<irr::core::string<unsigned_short>_>::operator[]
                           ((array<irr::core::string<unsigned_short>_> *)&origstr[5].allocated,
                            local_34);
        sVar6 = core::string<unsigned_short>::size(psVar7);
        bVar3 = equalsn((CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)origstr,str1,puVar8,
                        sVar6 + -1);
        if (bVar3) {
          local_30 = local_34;
          break;
        }
      }
      if (local_30 == 0xffffffff) {
        core::string<unsigned_short>::subString(&local_70,(s32)_oldPos,specialChar);
        core::string<unsigned_short>::append((string<unsigned_short> *)this,&local_70);
        core::string<unsigned_short>::~string(&local_70);
        local_24 = local_24 + 1;
      }
      else {
        core::string<unsigned_short>::subString(&local_60,(s32)_oldPos,specialChar);
        core::string<unsigned_short>::append((string<unsigned_short> *)this,&local_60);
        core::string<unsigned_short>::~string(&local_60);
        psVar7 = core::array<irr::core::string<unsigned_short>_>::operator[]
                           ((array<irr::core::string<unsigned_short>_> *)&origstr[5].allocated,
                            local_30);
        puVar8 = core::string<unsigned_short>::operator[](psVar7,0);
        core::string<unsigned_short>::append((string<unsigned_short> *)this,*puVar8);
        psVar7 = core::array<irr::core::string<unsigned_short>_>::operator[]
                           ((array<irr::core::string<unsigned_short>_> *)&origstr[5].allocated,
                            local_30);
        sVar6 = core::string<unsigned_short>::size(psVar7);
        local_24 = sVar6 + local_24;
      }
      specialChar = local_24;
      local_24 = core::string<unsigned_short>::findNext(_oldPos,0x26,local_24);
    }
    sVar6 = core::string<unsigned_short>::size(_oldPos);
    length = specialChar;
    uVar9 = extraout_RDX_00;
    if (iVar2 < sVar6 + -1) {
      core::string<unsigned_short>::size(_oldPos);
      core::string<unsigned_short>::subString(&local_80,(s32)_oldPos,length);
      core::string<unsigned_short>::append((string<unsigned_short> *)this,&local_80);
      core::string<unsigned_short>::~string(&local_80);
      uVar9 = extraout_RDX_01;
    }
  }
  sVar10.allocated = (int)uVar9;
  sVar10.used = (int)((ulong)uVar9 >> 0x20);
  sVar10.array = (unsigned_short *)this;
  return sVar10;
}

Assistant:

core::string<char_type> replaceSpecialCharacters(
		core::string<char_type>& origstr)
	{
		int pos = origstr.findFirst(L'&');
		int oldPos = 0;

		if (pos == -1)
			return origstr;

		core::string<char_type> newstr;

		while(pos != -1 && pos < origstr.size()-2)
		{
			// check if it is one of the special characters

			int specialChar = -1;
			for (int i=0; i<(int)SpecialCharacters.size(); ++i)
			{
				const char_type* p = &origstr.c_str()[pos]+1;

				if (equalsn(&SpecialCharacters[i][1], p, SpecialCharacters[i].size()-1))
				{
					specialChar = i;
					break;
				}
			}

			if (specialChar != -1)
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos));
				newstr.append(SpecialCharacters[specialChar][0]);
				pos += SpecialCharacters[specialChar].size();
			}
			else
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos + 1));
				pos += 1;
			}

			// find next &
			oldPos = pos;
			pos = origstr.findNext(L'&', pos);		
		}

		if (oldPos < origstr.size()-1)
			newstr.append(origstr.subString(oldPos, origstr.size()-oldPos));

		return newstr;
	}